

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O3

UBool isSingleOrLead(int32_t (*stateTable) [256],uint8_t state,UBool isDBCSOnly,uint8_t b)

{
  UBool UVar1;
  undefined3 in_register_00000009;
  uint uVar2;
  undefined7 in_register_00000031;
  
  uVar2 = *(uint *)((long)*stateTable +
                   (ulong)CONCAT31(in_register_00000009,b) * 4 +
                   (ulong)(uint)((int)CONCAT71(in_register_00000031,state) << 10));
  if (-1 < (int)uVar2) {
    UVar1 = hasValidTrailBytes(stateTable,(uint8_t)(uVar2 >> 0x18));
    return UVar1;
  }
  uVar2 = uVar2 >> 0x14 & 0xf;
  return uVar2 != 7 && (isDBCSOnly == '\0' || uVar2 != 8);
}

Assistant:

static UBool
isSingleOrLead(const int32_t (*stateTable)[256], uint8_t state, UBool isDBCSOnly, uint8_t b) {
    const int32_t *row=stateTable[state];
    int32_t entry=row[b];
    if(MBCS_ENTRY_IS_TRANSITION(entry)) {   /* lead byte */
        return hasValidTrailBytes(stateTable, (uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry));
    } else {
        uint8_t action=(uint8_t)(MBCS_ENTRY_FINAL_ACTION(entry));
        if(action==MBCS_STATE_CHANGE_ONLY && isDBCSOnly) {
            return FALSE;   /* SI/SO are illegal for DBCS-only conversion */
        } else {
            return action!=MBCS_STATE_ILLEGAL;
        }
    }
}